

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O1

void leveldb::RunConcurrent(int run)

{
  int iVar1;
  Env *pEVar2;
  uint uVar3;
  uint uVar4;
  Random rnd;
  TestState state;
  Random local_104;
  TestState local_100;
  
  iVar1 = test::RandomSeed();
  uVar3 = run * 100 + iVar1;
  local_104.seed_ = uVar3 & 0x7fffffff;
  if ((local_104.seed_ == 0x7fffffff) || (local_104.seed_ == 0)) {
    local_104.seed_ = 1;
  }
  uVar4 = 0;
  do {
    if ((uVar4 * -0x3d70a3d7 >> 2 | uVar4 * 0x40000000) < 0x28f5c29) {
      fprintf(_stderr,"Run %d of %d\n",(ulong)uVar4,1000);
    }
    ConcurrentTest::ConcurrentTest(&local_100.t_);
    local_100.quit_flag_._M_base._M_i = (__atomic_base<bool>)false;
    local_100.mu_.mu_.super___mutex_base._M_mutex._32_4_ = 0;
    local_100._140_8_ = 0;
    local_100.mu_.mu_.super___mutex_base._M_mutex._16_8_ = 0;
    local_100.mu_.mu_.super___mutex_base._M_mutex._24_4_ = 0;
    local_100.mu_.mu_.super___mutex_base._M_mutex._28_4_ = 0;
    local_100.mu_.mu_.super___mutex_base._M_mutex.__align = 0;
    local_100.mu_.mu_.super___mutex_base._M_mutex._8_8_ = 0;
    local_100.seed_ = uVar3 + 1;
    std::condition_variable::condition_variable(&local_100.state_cv_.cv_);
    local_100.state_cv_.mu_ = &local_100.mu_;
    pEVar2 = Env::Default();
    (*pEVar2->_vptr_Env[0xf])(pEVar2,ConcurrentReader,&local_100);
    TestState::Wait(&local_100,RUNNING);
    iVar1 = 1000;
    do {
      ConcurrentTest::WriteStep(&local_100.t_,&local_104);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    local_100.quit_flag_._M_base._M_i = (__atomic_base<bool>)true;
    TestState::Wait(&local_100,DONE);
    std::condition_variable::~condition_variable(&local_100.state_cv_.cv_);
    Arena::~Arena(&local_100.t_.arena_);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 1000);
  return;
}

Assistant:

static void RunConcurrent(int run) {
  const int seed = test::RandomSeed() + (run * 100);
  Random rnd(seed);
  const int N = 1000;
  const int kSize = 1000;
  for (int i = 0; i < N; i++) {
    if ((i % 100) == 0) {
      fprintf(stderr, "Run %d of %d\n", i, N);
    }
    TestState state(seed + 1);
    Env::Default()->Schedule(ConcurrentReader, &state);
    state.Wait(TestState::RUNNING);
    for (int i = 0; i < kSize; i++) {
      state.t_.WriteStep(&rnd);
    }
    state.quit_flag_.store(true, std::memory_order_release);
    state.Wait(TestState::DONE);
  }
}